

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O2

void __thiscall
spvtools::opt::DominatorTree::InitializeTree(DominatorTree *this,CFG *cfg,Function *f)

{
  BasicBlock *bb;
  pointer ppVar1;
  DominatorTreeNode *pDVar2;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  _Var3;
  DominatorTree *this_00;
  pointer ppVar4;
  BasicBlock *pBVar5;
  DominatorTreeNode *first;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  edges;
  DominatorTreeNode *local_50;
  _Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  local_48;
  
  ClearTree(this);
  if ((f->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (f->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar5 = &cfg->pseudo_exit_block_;
    if (this->postdominator_ == false) {
      pBVar5 = &cfg->pseudo_entry_block_;
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetDominatorEdges(this,f,pBVar5,
                      (vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                       *)&local_48);
    ppVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = local_48._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1;
        ppVar4 = ppVar4 + 1) {
      pBVar5 = ppVar4->first;
      bb = ppVar4->second;
      local_50 = GetOrInsertNode(this,pBVar5);
      if (pBVar5 == bb) {
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::DominatorTreeNode*const>>
                          ((this->roots_).
                           super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->roots_).
                           super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        this_00 = this;
        if (_Var3._M_current ==
            (this->roots_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001db078;
      }
      else {
        pDVar2 = GetOrInsertNode(this,bb);
        local_50->parent_ = pDVar2;
        this_00 = (DominatorTree *)&pDVar2->children_;
LAB_001db078:
        std::
        vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
        ::push_back(&this_00->roots_,&local_50);
      }
    }
    ResetDFNumbering(this);
    std::
    _Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void DominatorTree::InitializeTree(const CFG& cfg, const Function* f) {
  ClearTree();

  // Skip over empty functions.
  if (f->cbegin() == f->cend()) {
    return;
  }

  const BasicBlock* placeholder_start_node =
      postdominator_ ? cfg.pseudo_exit_block() : cfg.pseudo_entry_block();

  // Get the immediate dominator for each node.
  std::vector<std::pair<BasicBlock*, BasicBlock*>> edges;
  GetDominatorEdges(f, placeholder_start_node, &edges);

  // Transform the vector<pair> into the tree structure which we can use to
  // efficiently query dominance.
  for (auto edge : edges) {
    DominatorTreeNode* first = GetOrInsertNode(edge.first);

    if (edge.first == edge.second) {
      if (std::find(roots_.begin(), roots_.end(), first) == roots_.end())
        roots_.push_back(first);
      continue;
    }

    DominatorTreeNode* second = GetOrInsertNode(edge.second);

    first->parent_ = second;
    second->children_.push_back(first);
  }
  ResetDFNumbering();
}